

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapecube.cpp
# Opt level: O0

void pzshape::TPZShapeCube::Shape3dCubeInternal
               (TPZVec<Fad<double>_> *x,int order,TPZVec<Fad<double>_> *phi)

{
  undefined *puVar1;
  int iVar2;
  Fad<double> *pFVar3;
  Fad<double> *v;
  Fad<double> *pFVar4;
  Fad<double> *this;
  TPZVec<Fad<double>_> *in_RDX;
  int in_ESI;
  TPZVec<Fad<double>_> *in_RDI;
  int index;
  int k;
  int j;
  int i;
  TPZVec<Fad<double>_> phi2;
  TPZVec<Fad<double>_> phi1;
  TPZVec<Fad<double>_> phi0;
  int ord;
  int ndim;
  Fad<double> *in_stack_fffffffffffffe30;
  double *in_stack_fffffffffffffe40;
  undefined8 in_stack_fffffffffffffe48;
  Fad<double> *in_stack_fffffffffffffe50;
  TPZVec<Fad<double>_> *this_00;
  undefined1 *size;
  TPZVec<Fad<double>_> *in_stack_fffffffffffffea0;
  int local_13c;
  int local_138;
  int local_134;
  TPZVec<Fad<double>_> local_108;
  undefined8 local_e8;
  TPZVec<Fad<double>_> local_c0;
  undefined8 local_a0;
  TPZVec<Fad<double>_> local_78;
  undefined8 local_48;
  undefined1 local_40 [32];
  int local_20;
  undefined4 local_1c;
  TPZVec<Fad<double>_> *local_18;
  int local_c;
  TPZVec<Fad<double>_> *local_8;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffe48 >> 0x20);
  local_1c = 3;
  if (0 < in_ESI) {
    local_c = in_ESI * in_ESI * in_ESI;
    pFVar3 = (Fad<double> *)(long)local_c;
    local_48 = 0;
    size = local_40;
    local_20 = in_ESI;
    local_18 = in_RDX;
    local_8 = in_RDI;
    Fad<double>::Fad(in_stack_fffffffffffffe50,iVar2,in_stack_fffffffffffffe40);
    (*in_RDX->_vptr_TPZVec[2])(in_RDX,pFVar3,size);
    Fad<double>::~Fad(in_stack_fffffffffffffe30);
    local_a0 = 0;
    Fad<double>::Fad(in_stack_fffffffffffffe50,iVar2,in_stack_fffffffffffffe40);
    TPZVec<Fad<double>_>::TPZVec(in_stack_fffffffffffffea0,(int64_t)size,pFVar3);
    Fad<double>::~Fad(in_stack_fffffffffffffe30);
    local_e8 = 0;
    Fad<double>::Fad(in_stack_fffffffffffffe50,iVar2,in_stack_fffffffffffffe40);
    TPZVec<Fad<double>_>::TPZVec(in_stack_fffffffffffffea0,(int64_t)size,pFVar3);
    Fad<double>::~Fad(in_stack_fffffffffffffe30);
    Fad<double>::Fad(in_stack_fffffffffffffe50,iVar2,in_stack_fffffffffffffe40);
    TPZVec<Fad<double>_>::TPZVec(in_stack_fffffffffffffea0,(int64_t)size,pFVar3);
    Fad<double>::~Fad(in_stack_fffffffffffffe30);
    puVar1 = TPZShapeLinear::FADfOrthogonal;
    pFVar3 = TPZVec<Fad<double>_>::operator[](local_8,0);
    (*(code *)puVar1)(pFVar3,local_20,&local_78);
    pFVar3 = (Fad<double> *)TPZShapeLinear::FADfOrthogonal;
    v = TPZVec<Fad<double>_>::operator[](local_8,1);
    (*(code *)pFVar3)(v,local_20,&local_c0);
    this_00 = (TPZVec<Fad<double>_> *)TPZShapeLinear::FADfOrthogonal;
    pFVar4 = TPZVec<Fad<double>_>::operator[](local_8,2);
    (*(code *)this_00)(pFVar4,local_20,&local_108);
    for (local_134 = 0; local_134 < local_20; local_134 = local_134 + 1) {
      for (local_138 = 0; local_138 < local_20; local_138 = local_138 + 1) {
        for (local_13c = 0; local_13c < local_20; local_13c = local_13c + 1) {
          iVar2 = local_20 * (local_20 * local_134 + local_138);
          pFVar4 = TPZVec<Fad<double>_>::operator[](&local_78,(long)local_134);
          TPZVec<Fad<double>_>::operator[](&local_c0,(long)local_138);
          operator*<Fad<double>,_Fad<double>,_nullptr>(v,pFVar3);
          TPZVec<Fad<double>_>::operator[](&local_108,(long)local_13c);
          operator*<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>,_nullptr>
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)v,pFVar3);
          this = TPZVec<Fad<double>_>::operator[](local_18,(long)(iVar2 + local_13c));
          Fad<double>::operator=
                    ((Fad<double> *)this_00,
                     (FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                      *)pFVar4);
          FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>::
          ~FadExpr((FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_Fad<double>_>_>
                    *)this);
          FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>::~FadExpr
                    ((FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *)this);
        }
      }
    }
    TPZVec<Fad<double>_>::~TPZVec(this_00);
    TPZVec<Fad<double>_>::~TPZVec(this_00);
    TPZVec<Fad<double>_>::~TPZVec(this_00);
  }
  return;
}

Assistant:

void TPZShapeCube::Shape3dCubeInternal(TPZVec<FADREAL> &x, int order,TPZVec<FADREAL> &phi)
	{
		const int ndim = 3;
		
		if(order < 1) return;
		int ord = order;//fSideOrder[18]-1;
		order = order*order*order;
		phi.Resize(order, FADREAL(ndim, 0.0));
		TPZVec<FADREAL> phi0(20, FADREAL(ndim, 0.0)),
		phi1(20, FADREAL(ndim, 0.0)),
		phi2(20, FADREAL(ndim, 0.0));
		TPZShapeLinear::FADfOrthogonal(x[0],ord,phi0);
		TPZShapeLinear::FADfOrthogonal(x[1],ord,phi1);
		TPZShapeLinear::FADfOrthogonal(x[2],ord,phi2);
		for (int i=0;i<ord;i++) {
			for (int j=0;j<ord;j++) {
				for (int k=0;k<ord;k++) {
					int index = ord*(ord*i+j)+k;
					//phi(index,0) =  phi0(i,0)* phi1(j,0)* phi2(k,0);
					phi[index] =  phi0[i] * phi1[j] * phi2[k];
					/*dphi(0,index) = dphi0(0,i)* phi1(j,0)* phi2(k,0);
					 dphi(1,index) =  phi0(i,0)*dphi1(0,j)* phi2(k,0);
					 dphi(2,index) =  phi0(i,0)* phi1(j,0)*dphi2(0,k);
					 */
				}
			}
		}
	}